

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_parser.c
# Opt level: O3

uchar * yajl_render_error_string(yajl_handle hand,uchar *jsonText,size_t jsonTextLen,int verbose)

{
  ulong uVar1;
  yajl_malloc_func p_Var2;
  void *pvVar3;
  bool bVar4;
  yajl_lex_error error;
  char *__s;
  size_t sVar5;
  size_t sVar6;
  uchar *__dest;
  uchar *__dest_00;
  uchar uVar7;
  ulong uVar8;
  char *__s_00;
  ulong uVar9;
  long lVar10;
  char text [72];
  uchar local_78 [72];
  
  uVar1 = hand->bytesConsumed;
  uVar7 = (hand->stateStack).stack[(hand->stateStack).used - 1];
  if (uVar7 == '\x03') {
    error = yajl_lex_get_error(hand->lexer);
    __s = yajl_lex_error_to_string(error);
    __s_00 = "lexical";
  }
  else {
    if (uVar7 != '\x02') {
      bVar4 = true;
      __s = (char *)0x0;
      lVar10 = 0xd;
      __s_00 = "unknown";
      goto LAB_00103b09;
    }
    __s = hand->parseError;
    __s_00 = "parse";
  }
  bVar4 = true;
  sVar5 = strlen(__s_00);
  if (__s == (char *)0x0) {
    lVar10 = sVar5 + 6;
    __s = (char *)0x0;
  }
  else {
    sVar6 = strlen(__s);
    lVar10 = sVar5 + sVar6 + 8;
    bVar4 = false;
  }
LAB_00103b09:
  __dest = (uchar *)(*(hand->alloc).malloc)((hand->alloc).ctx,lVar10 + 2);
  if (__dest == (uchar *)0x0) {
    __dest = (uchar *)0x0;
  }
  else {
    *__dest = '\0';
    strcat((char *)__dest,__s_00);
    sVar5 = strlen((char *)__dest);
    builtin_memcpy(__dest + sVar5," error",7);
    if (!bVar4) {
      sVar5 = strlen((char *)__dest);
      (__dest + sVar5)[0] = ':';
      (__dest + sVar5)[1] = ' ';
      __dest[sVar5 + 2] = '\0';
      strcat((char *)__dest,__s);
    }
    sVar5 = strlen((char *)__dest);
    (__dest + sVar5)[0] = '\n';
    (__dest + sVar5)[1] = '\0';
    if (verbose != 0) {
      sVar5 = 0x28 - uVar1;
      uVar9 = 0;
      if (0x1d < uVar1) {
        uVar9 = uVar1 - 0x1e;
        sVar5 = 10;
      }
      uVar8 = uVar1 + 0x1e;
      if (jsonTextLen <= uVar1 + 0x1e) {
        uVar8 = jsonTextLen;
      }
      if (sVar5 != 0) {
        memset(local_78,0x20,sVar5);
      }
      if (uVar9 < uVar8) {
        lVar10 = 0;
        do {
          uVar7 = jsonText[lVar10 + uVar9];
          if ((uVar7 == '\r') || (uVar7 == '\n')) {
            uVar7 = ' ';
          }
          local_78[lVar10 + sVar5] = uVar7;
          lVar10 = lVar10 + 1;
        } while (uVar8 - uVar9 != lVar10);
        sVar5 = sVar5 + lVar10;
      }
      (local_78 + sVar5)[0] = '\n';
      (local_78 + sVar5)[1] = '\0';
      p_Var2 = (hand->alloc).malloc;
      pvVar3 = (hand->alloc).ctx;
      sVar5 = strlen((char *)__dest);
      sVar6 = strlen((char *)local_78);
      __dest_00 = (uchar *)(*p_Var2)(pvVar3,(size_t)sVar5 + (size_t)sVar6 + 0x2b);
      if (__dest_00 != (uchar *)0x0) {
        *__dest_00 = '\0';
        strcat((char *)__dest_00,(char *)__dest);
        strcat((char *)__dest_00,(char *)local_78);
        sVar5 = strlen((char *)__dest_00);
        builtin_memcpy(__dest_00 + sVar5,"                     (right here) ------^\n",0x2b);
      }
      (*(hand->alloc).free)((hand->alloc).ctx,__dest);
      __dest = __dest_00;
    }
  }
  return __dest;
}

Assistant:

unsigned char *
yajl_render_error_string(yajl_handle hand, const unsigned char * jsonText,
                         size_t jsonTextLen, int verbose)
{
    size_t offset = hand->bytesConsumed;
    unsigned char * str;
    const char * errorType = NULL;
    const char * errorText = NULL;
    char text[72];
    const char * arrow = "                     (right here) ------^\n";

    if (yajl_bs_current(hand->stateStack) == yajl_state_parse_error) {
        errorType = "parse";
        errorText = hand->parseError;
    } else if (yajl_bs_current(hand->stateStack) == yajl_state_lexical_error) {
        errorType = "lexical";
        errorText = yajl_lex_error_to_string(yajl_lex_get_error(hand->lexer));
    } else {
        errorType = "unknown";
    }

    {
        size_t memneeded = 0;
        memneeded += strlen(errorType);
        memneeded += strlen(" error");
        if (errorText != NULL) {
            memneeded += strlen(": ");
            memneeded += strlen(errorText);
        }
        str = (unsigned char *) YA_MALLOC(&(hand->alloc), memneeded + 2);
        if (!str) return NULL;
        str[0] = 0;
        strcat((char *) str, errorType);
        strcat((char *) str, " error");
        if (errorText != NULL) {
            strcat((char *) str, ": ");
            strcat((char *) str, errorText);
        }
        strcat((char *) str, "\n");
    }

    /* now we append as many spaces as needed to make sure the error
     * falls at char 41, if verbose was specified */
    if (verbose) {
        size_t start, end, i;
        size_t spacesNeeded;

        spacesNeeded = (offset < 30 ? 40 - offset : 10);
        start = (offset >= 30 ? offset - 30 : 0);
        end = (offset + 30 > jsonTextLen ? jsonTextLen : offset + 30);

        for (i=0;i<spacesNeeded;i++) text[i] = ' ';

        for (;start < end;start++, i++) {
            if (jsonText[start] != '\n' && jsonText[start] != '\r')
            {
                text[i] = jsonText[start];
            }
            else
            {
                text[i] = ' ';
            }
        }
        assert(i <= 71);
        text[i++] = '\n';
        text[i] = 0;
        {
            char * newStr = (char *)
                YA_MALLOC(&(hand->alloc), (unsigned int)(strlen((char *) str) +
                                                         strlen((char *) text) +
                                                         strlen(arrow) + 1));
            if (newStr) {
                newStr[0] = 0;
                strcat((char *) newStr, (char *) str);
                strcat((char *) newStr, text);
                strcat((char *) newStr, arrow);
            }
            YA_FREE(&(hand->alloc), str);
            str = (unsigned char *) newStr;
        }
    }
    return str;
}